

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjExporter.cpp
# Opt level: O0

void __thiscall
Assimp::ObjExporter::AddMesh(ObjExporter *this,aiString *name,aiMesh *m,aiMatrix4x4 *mat)

{
  long lVar1;
  long lVar2;
  undefined8 uVar3;
  long lVar4;
  long lVar5;
  ai_real _g;
  ai_real _r;
  uint uVar6;
  uint uVar7;
  float *pfVar8;
  reference pvVar9;
  reference pvVar10;
  uint *puVar11;
  undefined8 *puVar12;
  aiVector3t<float> aVar13;
  aiMatrix3x3t<float> local_198;
  undefined1 local_174 [8];
  aiVector3D norm;
  aiColor3D aStack_15c;
  vertexData local_150;
  undefined8 local_138;
  aiColor4D col4;
  aiVector3D vert;
  uint idx;
  uint a;
  Face *face;
  aiFace *f;
  undefined1 local_e8 [4];
  uint i;
  allocator local_c1;
  string local_c0 [32];
  reference local_a0;
  MeshInstance *mesh;
  MeshInstance local_88;
  aiMatrix4x4 *local_28;
  aiMatrix4x4 *mat_local;
  aiMesh *m_local;
  aiString *name_local;
  ObjExporter *this_local;
  
  local_88.faces.
  super__Vector_base<Assimp::ObjExporter::Face,_std::allocator<Assimp::ObjExporter::Face>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_88.faces.
  super__Vector_base<Assimp::ObjExporter::Face,_std::allocator<Assimp::ObjExporter::Face>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_88.matname.field_2._M_allocated_capacity = 0;
  local_88.matname.field_2._8_8_ = 0;
  local_88.matname._M_dataplus = (_Alloc_hider)0x0;
  local_88.matname._1_7_ = 0;
  local_88.matname._M_string_length = 0;
  local_88.name.field_2._M_allocated_capacity = 0;
  local_88.name.field_2._8_8_ = 0;
  local_88.name._M_dataplus = (_Alloc_hider)0x0;
  local_88.name._1_7_ = 0;
  local_88.name._M_string_length = 0;
  local_88.faces.
  super__Vector_base<Assimp::ObjExporter::Face,_std::allocator<Assimp::ObjExporter::Face>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_28 = mat;
  mat_local = (aiMatrix4x4 *)m;
  m_local = (aiMesh *)name;
  name_local = (aiString *)this;
  MeshInstance::MeshInstance(&local_88);
  std::vector<Assimp::ObjExporter::MeshInstance,_std::allocator<Assimp::ObjExporter::MeshInstance>_>
  ::push_back(&this->mMeshes,&local_88);
  MeshInstance::~MeshInstance(&local_88);
  local_a0 = std::
             vector<Assimp::ObjExporter::MeshInstance,_std::allocator<Assimp::ObjExporter::MeshInstance>_>
             ::back(&this->mMeshes);
  lVar1._0_4_ = mat_local->d1;
  lVar1._4_4_ = mat_local->d2;
  if (lVar1 != 0) {
    this->useVc = true;
  }
  puVar11 = &m_local->mNumVertices;
  uVar7 = m_local->mPrimitiveTypes;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_c0,(char *)puVar11,(ulong)uVar7,&local_c1);
  std::__cxx11::string::operator=((string *)local_a0,local_c0);
  std::__cxx11::string::~string(local_c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_c1);
  GetMaterialName_abi_cxx11_((string *)local_e8,this,(uint)mat_local[3].c3);
  std::__cxx11::string::operator=((string *)&local_a0->matname,(string *)local_e8);
  std::__cxx11::string::~string((string *)local_e8);
  std::vector<Assimp::ObjExporter::Face,_std::allocator<Assimp::ObjExporter::Face>_>::resize
            (&local_a0->faces,(ulong)(uint)mat_local->a3);
  for (f._4_4_ = 0.0; (uint)f._4_4_ < (uint)mat_local->a3; f._4_4_ = (float)((int)f._4_4_ + 1)) {
    pfVar8 = (float *)(*(long *)&mat_local[3].b1 + (ulong)(uint)f._4_4_ * 0x10);
    pvVar9 = std::vector<Assimp::ObjExporter::Face,_std::allocator<Assimp::ObjExporter::Face>_>::
             operator[](&local_a0->faces,(ulong)(uint)f._4_4_);
    if (*pfVar8 == 1.4013e-45) {
      pvVar9->kind = 'p';
    }
    else if (*pfVar8 == 2.8026e-45) {
      pvVar9->kind = 'l';
    }
    else {
      pvVar9->kind = 'f';
    }
    std::vector<Assimp::ObjExporter::FaceVertex,_std::allocator<Assimp::ObjExporter::FaceVertex>_>::
    resize(&pvVar9->indices,(ulong)(uint)*pfVar8);
    for (vert.z = 0.0; (uint)vert.z < (uint)*pfVar8; vert.z = (float)((int)vert.z + 1)) {
      uVar7 = *(uint *)(*(long *)(pfVar8 + 2) + (ulong)(uint)vert.z * 4);
      aVar13 = ::operator*(local_28,(aiVector3t<float> *)
                                    (*(long *)&mat_local->b1 + (ulong)uVar7 * 0xc));
      col4._8_8_ = aVar13._0_8_;
      lVar2._0_4_ = mat_local->d1;
      lVar2._4_4_ = mat_local->d2;
      if (lVar2 == 0) {
        norm._4_8_ = col4._8_8_;
        aiColor3D::aiColor3D(&aStack_15c,0.0,0.0,0.0);
        uVar6 = indexMap<Assimp::ObjExporter::vertexData,_Assimp::ObjExporter::vertexDataCompare>::
                getIndex(&this->mVpMap,(vertexData *)&norm.y);
        pvVar10 = std::
                  vector<Assimp::ObjExporter::FaceVertex,_std::allocator<Assimp::ObjExporter::FaceVertex>_>
                  ::operator[](&pvVar9->indices,(ulong)(uint)vert.z);
        pvVar10->vp = uVar6;
      }
      else {
        puVar12 = (undefined8 *)(*(long *)&mat_local->d1 + (ulong)uVar7 * 0x10);
        uVar3 = *puVar12;
        col4._0_8_ = puVar12[1];
        local_138._0_4_ = (ai_real)uVar3;
        local_138._4_4_ = (ai_real)((ulong)uVar3 >> 0x20);
        _g = local_138._4_4_;
        local_150.vp._0_8_ = col4._8_8_;
        local_150.vp.z = aVar13.z;
        _r = (ai_real)local_138;
        local_138 = uVar3;
        aiColor3D::aiColor3D(&local_150.vc,_r,_g,col4.r);
        uVar6 = indexMap<Assimp::ObjExporter::vertexData,_Assimp::ObjExporter::vertexDataCompare>::
                getIndex(&this->mVpMap,&local_150);
        pvVar10 = std::
                  vector<Assimp::ObjExporter::FaceVertex,_std::allocator<Assimp::ObjExporter::FaceVertex>_>
                  ::operator[](&pvVar9->indices,(ulong)(uint)vert.z);
        pvVar10->vp = uVar6;
      }
      lVar4._0_4_ = mat_local->b3;
      lVar4._4_4_ = mat_local->b4;
      if (lVar4 == 0) {
        pvVar10 = std::
                  vector<Assimp::ObjExporter::FaceVertex,_std::allocator<Assimp::ObjExporter::FaceVertex>_>
                  ::operator[](&pvVar9->indices,(ulong)(uint)vert.z);
        pvVar10->vn = 0;
      }
      else {
        aiMatrix3x3t<float>::aiMatrix3x3t(&local_198,local_28);
        aVar13 = ::operator*(&local_198,
                             (aiVector3t<float> *)(*(long *)&mat_local->b3 + (ulong)uVar7 * 0xc));
        norm.x = aVar13.z;
        local_174 = aVar13._0_8_;
        uVar6 = indexMap<aiVector3t<float>,_Assimp::ObjExporter::aiVectorCompare>::getIndex
                          (&this->mVnMap,(aiVector3t<float> *)local_174);
        pvVar10 = std::
                  vector<Assimp::ObjExporter::FaceVertex,_std::allocator<Assimp::ObjExporter::FaceVertex>_>
                  ::operator[](&pvVar9->indices,(ulong)(uint)vert.z);
        pvVar10->vn = uVar6;
      }
      lVar5._0_4_ = mat_local[1].d1;
      lVar5._4_4_ = mat_local[1].d2;
      if (lVar5 == 0) {
        pvVar10 = std::
                  vector<Assimp::ObjExporter::FaceVertex,_std::allocator<Assimp::ObjExporter::FaceVertex>_>
                  ::operator[](&pvVar9->indices,(ulong)(uint)vert.z);
        pvVar10->vt = 0;
      }
      else {
        uVar7 = indexMap<aiVector3t<float>,_Assimp::ObjExporter::aiVectorCompare>::getIndex
                          (&this->mVtMap,
                           (aiVector3t<float> *)(*(long *)&mat_local[1].d1 + (ulong)uVar7 * 0xc));
        pvVar10 = std::
                  vector<Assimp::ObjExporter::FaceVertex,_std::allocator<Assimp::ObjExporter::FaceVertex>_>
                  ::operator[](&pvVar9->indices,(ulong)(uint)vert.z);
        pvVar10->vt = uVar7;
      }
    }
  }
  return;
}

Assistant:

void ObjExporter::AddMesh(const aiString& name, const aiMesh* m, const aiMatrix4x4& mat) {
    mMeshes.push_back(MeshInstance() );
    MeshInstance& mesh = mMeshes.back();

    if ( nullptr != m->mColors[ 0 ] ) {
        useVc = true;
    }

    mesh.name = std::string( name.data, name.length );
    mesh.matname = GetMaterialName(m->mMaterialIndex);

    mesh.faces.resize(m->mNumFaces);

    for(unsigned int i = 0; i < m->mNumFaces; ++i) {
        const aiFace& f = m->mFaces[i];

        Face& face = mesh.faces[i];
        switch (f.mNumIndices) {
            case 1:
                face.kind = 'p';
                break;
            case 2:
                face.kind = 'l';
                break;
            default:
                face.kind = 'f';
        }
        face.indices.resize(f.mNumIndices);

        for(unsigned int a = 0; a < f.mNumIndices; ++a) {
            const unsigned int idx = f.mIndices[a];

            aiVector3D vert = mat * m->mVertices[idx];

            if ( nullptr != m->mColors[ 0 ] ) {
                aiColor4D col4 = m->mColors[ 0 ][ idx ];
                face.indices[a].vp = mVpMap.getIndex({vert, aiColor3D(col4.r, col4.g, col4.b)});
            } else {
                face.indices[a].vp = mVpMap.getIndex({vert, aiColor3D(0,0,0)});
            }

            if (m->mNormals) {
                aiVector3D norm = aiMatrix3x3(mat) * m->mNormals[idx];
                face.indices[a].vn = mVnMap.getIndex(norm);
            } else {
                face.indices[a].vn = 0;
            }

            if ( m->mTextureCoords[ 0 ] ) {
                face.indices[a].vt = mVtMap.getIndex(m->mTextureCoords[0][idx]);
            } else {
                face.indices[a].vt = 0;
            }
        }
    }
}